

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplosionDescriptor.cpp
# Opt level: O3

bool __thiscall
DIS::ExplosionDescriptor::operator==(ExplosionDescriptor *this,ExplosionDescriptor *rhs)

{
  undefined2 uVar1;
  undefined2 uVar3;
  ulong uVar2;
  undefined4 uVar4;
  bool bVar5;
  undefined4 in_ECX;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  bVar5 = EntityType::operator==(&this->_explodingObject,&rhs->_explodingObject);
  uVar2._0_2_ = this->_explosiveMaterial;
  uVar2._2_2_ = this->_padding;
  uVar2._4_4_ = this->_explosiveForce;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  uVar1 = rhs->_explosiveMaterial;
  uVar3 = rhs->_padding;
  uVar4 = rhs->_explosiveForce;
  auVar9._0_2_ = -(ushort)(uVar1 == (undefined2)uVar2);
  auVar9._2_2_ = -(ushort)(uVar3 == uVar2._2_2_);
  auVar9._4_2_ = -(ushort)((short)uVar4 == (short)uVar2._4_4_);
  auVar9._6_2_ = -(ushort)((short)((uint)uVar4 >> 0x10) == (short)((uint)uVar2._4_4_ >> 0x10));
  auVar9._8_2_ = 0xffff;
  auVar9._10_2_ = 0xffff;
  auVar9._12_2_ = 0xffff;
  auVar9._14_2_ = 0xffff;
  auVar7 = pshuflw(auVar7,auVar9,0x50);
  auVar8._0_4_ = auVar7._0_4_;
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar7._4_4_;
  auVar8._12_4_ = auVar7._4_4_;
  uVar6 = movmskpd(in_ECX,auVar8);
  return (bool)(bVar5 & (byte)uVar6 & (byte)uVar6 >> 1 &
               this->_explosiveForce == rhs->_explosiveForce);
}

Assistant:

bool ExplosionDescriptor::operator ==(const ExplosionDescriptor& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_explodingObject == rhs._explodingObject) ) ivarsEqual = false;
     if( ! (_explosiveMaterial == rhs._explosiveMaterial) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;
     if( ! (_explosiveForce == rhs._explosiveForce) ) ivarsEqual = false;

    return ivarsEqual;
 }